

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::OneLineParser::~OneLineParser(OneLineParser *this)

{
  cmProcessTools::LineParser::~LineParser(&this->super_LineParser);
  operator_delete(this,0x48);
  return;
}

Assistant:

OneLineParser(cmCTestGIT* git, const char* prefix, std::string& l)
    : Line1(l)
  {
    this->SetLog(&git->Log, prefix);
  }